

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermUnary * __thiscall
glslang::TIntermediate::addUnaryNode
          (TIntermediate *this,TOperator op,TIntermTyped *child,TSourceLoc *loc)

{
  int iVar1;
  TIntermUnary *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  this_00 = (TIntermUnary *)
            TIntermNode::operator_new((TIntermNode *)0xf8,CONCAT44(in_register_00000034,op));
  TIntermUnary::TIntermUnary(this_00,op);
  if (loc->line == 0) {
    iVar1 = (**(child->super_TIntermNode)._vptr_TIntermNode)(child);
    loc = (TSourceLoc *)CONCAT44(extraout_var,iVar1);
  }
  (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
            (this_00,loc);
  (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x30])
            (this_00,child);
  return this_00;
}

Assistant:

TIntermUnary* TIntermediate::addUnaryNode(TOperator op, TIntermTyped* child, const TSourceLoc& loc) const
{
    TIntermUnary* node = new TIntermUnary(op);
    node->setLoc(loc.line != 0 ? loc : child->getLoc());
    node->setOperand(child);

    return node;
}